

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_subfi_i32_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_i32 ret,int32_t arg1,TCGv_i32 arg2)

{
  TCGv_i32 arg1_00;
  TCGv_i32 t0;
  TCGv_i32 arg2_local;
  int32_t arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict4 *tcg_ctx_local;
  
  if (arg1 == 0) {
    tcg_gen_op2_i32(tcg_ctx,INDEX_op_neg_i32,ret,arg2);
  }
  else {
    arg1_00 = tcg_const_i32_mipsel(tcg_ctx,arg1);
    tcg_gen_sub_i32(tcg_ctx,ret,arg1_00,arg2);
    tcg_temp_free_i32(tcg_ctx,arg1_00);
  }
  return;
}

Assistant:

void tcg_gen_subfi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, int32_t arg1, TCGv_i32 arg2)
{
    if (arg1 == 0 && TCG_TARGET_HAS_neg_i32) {
        /* Don't recurse with tcg_gen_neg_i32.  */
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_neg_i32, ret, arg2);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg1);
        tcg_gen_sub_i32(tcg_ctx, ret, t0, arg2);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}